

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void s390x_tr_init_disas_context(DisasContextBase *dcbase,CPUState *cs)

{
  uc_struct_conflict14 *uc;
  DisasContextBase *__mptr;
  DisasContext_conflict13 *dc;
  CPUState *cs_local;
  DisasContextBase *dcbase_local;
  
  dcbase[3].pc_first = (target_ulong)cs->uc;
  if ((dcbase->tb->flags & 2) == 0) {
    dcbase->pc_first = dcbase->pc_first & 0x7fffffff;
    dcbase->pc_next = dcbase->pc_first;
  }
  *(undefined4 *)&dcbase[2].singlestep_enabled = 4;
  dcbase[2].pc_next = dcbase->tb->cs_base;
  *(byte *)&dcbase[3].tb = dcbase->singlestep_enabled & 1;
  return;
}

Assistant:

static void s390x_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = cs->uc;

    // unicorn handle
    dc->uc = uc;

    /* 31-bit mode */
    if (!(dc->base.tb->flags & FLAG_MASK_64)) {
        dc->base.pc_first &= 0x7fffffff;
        dc->base.pc_next = dc->base.pc_first;
    }

    dc->cc_op = CC_OP_DYNAMIC;
    dc->ex_value = dc->base.tb->cs_base;
    dc->do_debug = dc->base.singlestep_enabled;
}